

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaBlast.c
# Opt level: O0

int * Cba_VecLoadFanins(Cba_Ntk_t *p,Vec_Int_t *vOut,int iFon,int *pFanins,int nFanins,int nTotal,
                       int fSigned)

{
  int iVar1;
  int *piVar2;
  int local_4c;
  int local_3c;
  int local_34;
  int Fill;
  int i;
  int nTotal_local;
  int nFanins_local;
  int *pFanins_local;
  int iFon_local;
  Vec_Int_t *vOut_local;
  Cba_Ntk_t *p_local;
  
  if (nTotal < nFanins) {
    __assert_fail("nFanins <= nTotal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaBlast.c"
                  ,0x79,
                  "int *Cba_VecLoadFanins(Cba_Ntk_t *, Vec_Int_t *, int, int *, int, int, int)");
  }
  iVar1 = Cba_FonIsReal(iFon);
  if (iVar1 == 0) {
    iVar1 = Cba_FonIsConst(iFon);
    if (iVar1 == 0) {
      if (iFon != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaBlast.c"
                      ,0x85,
                      "int *Cba_VecLoadFanins(Cba_Ntk_t *, Vec_Int_t *, int, int *, int, int, int)")
        ;
      }
      Vec_IntFill(vOut,nTotal,0);
    }
    else {
      Cba_BlastConst(p,vOut,iFon,nTotal,fSigned);
    }
  }
  else {
    if (fSigned == 0) {
      local_3c = 0;
    }
    else {
      local_3c = pFanins[nFanins + -1];
    }
    Vec_IntClear(vOut);
    for (local_34 = 0; local_34 < nTotal; local_34 = local_34 + 1) {
      if (local_34 < nFanins) {
        local_4c = pFanins[local_34];
      }
      else {
        local_4c = local_3c;
      }
      Vec_IntPush(vOut,local_4c);
    }
  }
  iVar1 = Vec_IntSize(vOut);
  if (iVar1 != nTotal) {
    __assert_fail("Vec_IntSize(vOut) == nTotal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaBlast.c"
                  ,0x86,
                  "int *Cba_VecLoadFanins(Cba_Ntk_t *, Vec_Int_t *, int, int *, int, int, int)");
  }
  piVar2 = Vec_IntArray(vOut);
  return piVar2;
}

Assistant:

int * Cba_VecLoadFanins( Cba_Ntk_t * p, Vec_Int_t * vOut, int iFon, int * pFanins, int nFanins, int nTotal, int fSigned )
{
    assert( nFanins <= nTotal );
    if ( Cba_FonIsReal(iFon) )
    {
        int i, Fill = fSigned ? pFanins[nFanins-1] : 0;
        Vec_IntClear( vOut );
        for( i = 0; i < nTotal; i++) 
            Vec_IntPush( vOut, i < nFanins ? pFanins[i] : Fill );
    }
    else if ( Cba_FonIsConst(iFon) )
        Cba_BlastConst( p, vOut, iFon, nTotal, fSigned );
    else if ( iFon == 0 ) // undriven input
        Vec_IntFill( vOut, nTotal, 0 );
    else assert( 0 );
    assert( Vec_IntSize(vOut) == nTotal );
    return Vec_IntArray( vOut );
}